

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor_impl.h
# Opt level: O2

bool __thiscall
iqnet::Reactor<iqnet::Null_lock>::handle_system_events(Reactor<iqnet::Null_lock> *this,Timeout ms)

{
  char cVar1;
  int iVar2;
  int in_ECX;
  HandlerState hs;
  HandlerStateList ret;
  HandlerStateList tmp;
  pollfd local_58;
  _List_base<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
  local_50;
  _List_base<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
  local_38;
  
  std::__cxx11::
  list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>::list
            ((list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
              *)&local_38,&this->handlers_states);
  if (local_38._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&local_38) {
    cVar1 = '\x01';
  }
  else {
    Reactor_poll_impl::reset(&this->impl,(HandlerStateList *)&local_38);
    local_50._M_impl._M_node._M_size = 0;
    local_50._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_50;
    local_50._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_50;
    iVar2 = Reactor_poll_impl::poll(&this->impl,(pollfd *)&local_50,(ulong)(uint)ms,in_ECX);
    cVar1 = (char)iVar2;
    if (cVar1 != '\0') {
      while (local_50._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_50)
      {
        local_58 = *(pollfd *)((long)local_50._M_impl._M_node.super__List_node_base._M_next + 0x10);
        std::__cxx11::
        list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
        ::pop_front((list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
                     *)&local_50);
        invoke_event_handler(this,(HandlerState *)&local_58);
      }
    }
    std::__cxx11::
    _List_base<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
    ::_M_clear(&local_50);
  }
  std::__cxx11::
  _List_base<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
  ::_M_clear(&local_38);
  return (bool)cVar1;
}

Assistant:

bool Reactor<Lock>::handle_system_events(Reactor_base::Timeout ms)
{
  scoped_lock lk(lock);
  HandlerStateList tmp(handlers_states);
  lk.unlock();

  // if all events were of "user" type
  if (tmp.empty())
    return true;

  impl.reset(tmp);
  HandlerStateList ret;
  bool succ = impl.poll(ret, ms);

  if (!succ)
    return false;

  while (!ret.empty())
  {
    HandlerState hs(ret.front());
    ret.pop_front();
    invoke_event_handler(hs);
  }

  return true;
}